

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  ImGuiWindow *window;
  bool bVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ImGuiWindow *pIVar7;
  
  pIVar2 = GImGui;
  if (under_this_window == (ImGuiWindow *)0x0) {
    uVar3 = (GImGui->WindowsFocusOrder).Size - 1;
  }
  else {
    iVar6 = -1;
    if ((under_this_window->Flags & 0x1000000) != 0) {
      do {
        under_this_window = under_this_window->ParentWindow;
      } while ((under_this_window->Flags & 0x1000000) != 0);
      iVar6 = 0;
    }
    uVar3 = under_this_window->FocusOrder + iVar6;
  }
  if (-1 < (int)uVar3) {
    lVar4 = (ulong)uVar3 + 1;
    do {
      pIVar7 = (GImGui->WindowsFocusOrder).Data[lVar4 + -1];
      if (((pIVar7 != ignore_window) && (pIVar7->WasActive == true)) &&
         ((~pIVar7->Flags & 0x40200U) != 0)) {
        window = pIVar7->NavLastChildNavWindow;
        if ((window == (ImGuiWindow *)0x0) || (window->WasActive == false)) {
          FocusWindow(pIVar7);
          return;
        }
        if (GImGui->NavWindow == window) {
          if (window == (ImGuiWindow *)0x0) {
            bVar1 = true;
            pIVar7 = (ImGuiWindow *)0x0;
            goto LAB_001e2da2;
          }
        }
        else {
          SetNavWindow(window);
          if (window == (ImGuiWindow *)0x0) {
            pIVar2->NavId = 0;
            pIVar2->NavFocusScopeId = 0;
            pIVar2->NavLayer = ImGuiNavLayer_Main;
            pIVar2->NavIdIsAlive = false;
            pIVar7 = (ImGuiWindow *)0x0;
            ClosePopupsOverWindow((ImGuiWindow *)0x0,false);
            bVar1 = true;
            goto LAB_001e2da2;
          }
          if (pIVar2->NavDisableMouseHover == true) {
            pIVar2->NavMousePosDirty = true;
          }
          pIVar2->NavId = window->NavLastIds[0];
          pIVar2->NavLayer = ImGuiNavLayer_Main;
          pIVar2->NavFocusScopeId = window->NavRootFocusScopeId;
          pIVar2->NavIdIsAlive = false;
          ClosePopupsOverWindow(window,false);
        }
        pIVar7 = window->RootWindow;
        bVar1 = false;
LAB_001e2da2:
        if (((pIVar2->ActiveId != 0) && (pIVar2->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
           ((pIVar2->ActiveIdWindow->RootWindow != pIVar7 &&
            (pIVar2->ActiveIdNoClearOnFocusLoss == false)))) {
          SetActiveID(0,(ImGuiWindow *)0x0);
        }
        if (!bVar1) {
          BringWindowToFocusFront(pIVar7);
          if (((uint)(pIVar7->Flags | window->Flags) >> 0xd & 1) == 0) {
            BringWindowToDisplayFront(pIVar7);
            return;
          }
        }
        return;
      }
      lVar5 = lVar4 + -1;
      bVar1 = 0 < lVar4;
      lVar4 = lVar5;
    } while (lVar5 != 0 && bVar1);
  }
  FocusWindow((ImGuiWindow *)0x0);
  return;
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;
    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        // Aim at root window behind us, if we are in a child window that's our own root (see #4640)
        int offset = -1;
        while (under_this_window->Flags & ImGuiWindowFlags_ChildWindow)
        {
            under_this_window = under_this_window->ParentWindow;
            offset = 0;
        }
        start_idx = FindWindowFocusIndex(under_this_window) + offset;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        IM_ASSERT(window == window->RootWindow);
        if (window != ignore_window && window->WasActive)
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}